

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutablePriorityQueue.h
# Opt level: O2

void __thiscall
MutablePriorityQueue<Vertex<std::pair<double,_double>_>_>::heapifyDown
          (MutablePriorityQueue<Vertex<std::pair<double,_double>_>_> *this,uint i)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  Vertex<std::pair<double,_double>_> *pVVar4;
  Vertex<std::pair<double,_double>_> *pVVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  pointer ppVVar9;
  ulong uVar10;
  ulong uVar11;
  
  ppVVar9 = (this->H).
            super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar4 = ppVVar9[i];
  bVar3 = this->inv;
  uVar7 = (ulong)((bVar3 & 1) << 4);
  while( true ) {
    uVar6 = i * 2;
    uVar10 = (ulong)uVar6;
    uVar11 = (long)(this->H).
                   super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar9 >> 3;
    if (uVar11 <= uVar10) break;
    uVar8 = uVar6 | 1;
    if ((uVar8 < uVar11) &&
       (dVar2 = *(double *)((long)&ppVVar9[uVar10]->dist + uVar7),
       pdVar1 = (double *)((long)&ppVVar9[uVar8]->dist + uVar7), uVar10 = (ulong)uVar6,
       *pdVar1 <= dVar2 && dVar2 != *pdVar1)) {
      uVar10 = (ulong)uVar8;
    }
    pVVar5 = ppVVar9[uVar10];
    dVar2 = *(double *)((long)&pVVar4->dist + uVar7);
    pdVar1 = (double *)((long)&pVVar5->dist + uVar7);
    if (dVar2 < *pdVar1 || dVar2 == *pdVar1) break;
    ppVVar9[i] = pVVar5;
    if ((bVar3 & 1U) == 0) {
      pVVar5->queueIndex = i;
    }
    else {
      pVVar5->queueIndexInv = i;
    }
    ppVVar9 = (this->H).
              super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    i = (uint)uVar10;
  }
  ppVVar9[i] = pVVar4;
  if ((bVar3 & 1U) == 0) {
    pVVar4->queueIndex = i;
  }
  else {
    pVVar4->queueIndexInv = i;
  }
  return;
}

Assistant:

void MutablePriorityQueue<T>::heapifyDown(unsigned i) {
	auto x = H[i];
	while (true) {
		unsigned k = leftChild(i);
		if (k >= H.size())
			break;
		if (k+1 < H.size() && (*H[k+1]).compare(*H[k], inv))
			++k; // right child of i
		if ( ! ((*H[k]).compare(*x, inv)) )
			break;
		set(i, H[k]);
		i = k;
	}
	set(i, x);
}